

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

double * gaussian_coeffs(int radius,double sigmaArg)

{
  int iVar1;
  double dVar2;
  double local_60;
  double coeff;
  int local_48;
  int count;
  int n;
  int x;
  double sum;
  double *result;
  double s;
  double sigma;
  double sigmaArg_local;
  double *pdStack_10;
  int radius_local;
  
  local_60 = sigmaArg;
  if (sigmaArg <= 0.0) {
    local_60 = (double)radius * 0.6666666666666666;
  }
  _n = 0.0;
  iVar1 = radius * 2 + 1;
  pdStack_10 = (double *)gdMalloc((long)iVar1 << 3);
  if (pdStack_10 == (double *)0x0) {
    pdStack_10 = (double *)0x0;
  }
  else {
    for (count = -radius; count <= radius; count = count + 1) {
      dVar2 = exp((double)-(count * count) / (local_60 * 2.0 * local_60));
      _n = dVar2 + _n;
      pdStack_10[count + radius] = dVar2;
    }
    for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
      pdStack_10[local_48] = pdStack_10[local_48] / _n;
    }
  }
  return pdStack_10;
}

Assistant:

static double *
gaussian_coeffs(int radius, double sigmaArg) {
    const double sigma = (sigmaArg <= 0.0) ? (2.0/3.0)*radius : sigmaArg;
    const double s = 2.0 * sigma * sigma;
    double *result;
    double sum = 0;
    int x, n, count;

    count = 2*radius + 1;

    result = gdMalloc(sizeof(double) * count);
    if (!result) {
        return NULL;
    }/* if */

    for (x = -radius; x <= radius; x++) {
        double coeff = exp(-(x*x)/s);

        sum += coeff;
        result[x + radius] = coeff;
    }/* for */

    for (n = 0; n < count; n++) {
        result[n] /= sum;
    }/* for */

    return result;
}